

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int uv_os_gethostname(char *buffer,size_t *size)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  char buf [65];
  char acStack_68 [64];
  undefined1 local_28;
  
  iVar1 = -0x16;
  if (size != (size_t *)0x0 && buffer != (char *)0x0) {
    if (*size != 0) {
      iVar1 = gethostname(acStack_68,0x41);
      if (iVar1 == 0) {
        local_28 = 0;
        sVar3 = strlen(acStack_68);
        if (sVar3 < *size) {
          memcpy(buffer,acStack_68,sVar3 + 1);
          *size = sVar3;
          iVar1 = 0;
        }
        else {
          *size = sVar3 + 1;
          iVar1 = -0x69;
        }
      }
      else {
        piVar2 = __errno_location();
        iVar1 = -*piVar2;
      }
    }
  }
  return iVar1;
}

Assistant:

int uv_os_gethostname(char* buffer, size_t* size) {
  /*
    On some platforms, if the input buffer is not large enough, gethostname()
    succeeds, but truncates the result. libuv can detect this and return ENOBUFS
    instead by creating a large enough buffer and comparing the hostname length
    to the size input.
  */
  char buf[MAXHOSTNAMELEN + 1];
  size_t len;

  if (buffer == NULL || size == NULL || *size == 0)
    return -EINVAL;

  if (gethostname(buf, sizeof(buf)) != 0)
    return -errno;

  buf[sizeof(buf) - 1] = '\0'; /* Null terminate, just to be safe. */
  len = strlen(buf);

  if (len >= *size) {
    *size = len + 1;
    return -ENOBUFS;
  }

  memcpy(buffer, buf, len + 1);
  *size = len;
  return 0;
}